

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::Model::MergeFrom(Model *this,Model *from)

{
  uint32 uVar1;
  void *pvVar2;
  LogMessage *other;
  ModelDescription *this_00;
  PipelineClassifier *this_01;
  PipelineClassifier *from_00;
  OneHotEncoder *this_02;
  OneHotEncoder *from_01;
  TextClassifier *this_03;
  TextClassifier *from_02;
  GLMClassifier *this_04;
  GLMClassifier *from_03;
  GLMRegressor *this_05;
  GLMRegressor *from_04;
  Normalizer *this_06;
  Normalizer *from_05;
  FeatureVectorizer *this_07;
  FeatureVectorizer *from_06;
  Scaler *this_08;
  Scaler *from_07;
  DictVectorizer *this_09;
  DictVectorizer *from_08;
  NonMaximumSuppression *this_10;
  NonMaximumSuppression *from_09;
  Imputer *this_11;
  Imputer *from_10;
  ArrayFeatureExtractor *this_12;
  ArrayFeatureExtractor *from_11;
  CategoricalMapping *this_13;
  CategoricalMapping *from_12;
  Pipeline *this_14;
  Pipeline *from_13;
  KNearestNeighborsClassifier *this_15;
  KNearestNeighborsClassifier *from_14;
  NeuralNetwork *this_16;
  NeuralNetwork *from_15;
  BayesianProbitRegressor *this_17;
  BayesianProbitRegressor *from_16;
  Gazetteer *this_18;
  Gazetteer *from_17;
  TreeEnsembleClassifier *this_19;
  TreeEnsembleClassifier *from_18;
  SerializedModel *this_20;
  SerializedModel *from_19;
  ItemSimilarityRecommender *this_21;
  ItemSimilarityRecommender *from_20;
  Identity *this_22;
  Identity *from_21;
  NeuralNetworkClassifier *this_23;
  NeuralNetworkClassifier *from_22;
  LinkedModel *this_24;
  LinkedModel *from_23;
  TreeEnsembleRegressor *this_25;
  TreeEnsembleRegressor *from_24;
  VisionFeaturePrint *this_26;
  VisionFeaturePrint *from_25;
  SupportVectorClassifier *this_27;
  SupportVectorClassifier *from_26;
  NeuralNetworkRegressor *this_28;
  NeuralNetworkRegressor *from_27;
  SoundAnalysisPreprocessing *this_29;
  SoundAnalysisPreprocessing *from_28;
  CustomModel *this_30;
  CustomModel *from_29;
  SupportVectorRegressor *this_31;
  SupportVectorRegressor *from_30;
  WordTagger *this_32;
  WordTagger *from_31;
  PipelineRegressor *this_33;
  PipelineRegressor *from_32;
  WordEmbedding *this_34;
  WordEmbedding *from_33;
  ModelDescription *from_34;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O2/mlmodel/format/Model.pb.cc"
               ,0x115b);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if ((from != (Model *)&_Model_default_instance_) &&
     (from->description_ != (ModelDescription *)0x0)) {
    this_00 = mutable_description(this);
    from_34 = from->description_;
    if (from_34 == (ModelDescription *)0x0) {
      from_34 = (ModelDescription *)&_ModelDescription_default_instance_;
    }
    ModelDescription::MergeFrom(this_00,from_34);
  }
  if (from->specificationversion_ != 0) {
    this->specificationversion_ = from->specificationversion_;
  }
  if (from->isupdatable_ == true) {
    this->isupdatable_ = true;
  }
  uVar1 = from->_oneof_case_[0];
  switch(uVar1) {
  case 600:
    this_02 = mutable_onehotencoder(this);
    from_01 = onehotencoder(from);
    OneHotEncoder::MergeFrom(this_02,from_01);
    break;
  case 0x259:
    this_11 = mutable_imputer(this);
    from_10 = imputer(from);
    Imputer::MergeFrom(this_11,from_10);
    break;
  case 0x25a:
    this_07 = mutable_featurevectorizer(this);
    from_06 = featurevectorizer(from);
    FeatureVectorizer::MergeFrom(this_07,from_06);
    break;
  case 0x25b:
    this_09 = mutable_dictvectorizer(this);
    from_08 = dictvectorizer(from);
    DictVectorizer::MergeFrom(this_09,from_08);
    break;
  case 0x25c:
    this_08 = mutable_scaler(this);
    from_07 = scaler(from);
    Scaler::MergeFrom(this_08,from_07);
    break;
  case 0x25d:
  case 0x260:
    break;
  case 0x25e:
    this_13 = mutable_categoricalmapping(this);
    from_12 = categoricalmapping(from);
    CategoricalMapping::MergeFrom(this_13,from_12);
    break;
  case 0x25f:
    this_06 = mutable_normalizer(this);
    from_05 = normalizer(from);
    Normalizer::MergeFrom(this_06,from_05);
    break;
  case 0x261:
    this_12 = mutable_arrayfeatureextractor(this);
    from_11 = arrayfeatureextractor(from);
    ArrayFeatureExtractor::MergeFrom(this_12,from_11);
    break;
  case 0x262:
    this_10 = mutable_nonmaximumsuppression(this);
    from_09 = nonmaximumsuppression(from);
    NonMaximumSuppression::MergeFrom(this_10,from_09);
    break;
  default:
    switch(uVar1) {
    case 2000:
      this_03 = mutable_textclassifier(this);
      from_02 = textclassifier(from);
      CoreMLModels::TextClassifier::MergeFrom(this_03,from_02);
      break;
    case 0x7d1:
      this_32 = mutable_wordtagger(this);
      from_31 = wordtagger(from);
      CoreMLModels::WordTagger::MergeFrom(this_32,from_31);
      break;
    case 0x7d2:
      this_26 = mutable_visionfeatureprint(this);
      from_25 = visionfeatureprint(from);
      CoreMLModels::VisionFeaturePrint::MergeFrom(this_26,from_25);
      break;
    case 0x7d3:
      this_29 = mutable_soundanalysispreprocessing(this);
      from_28 = soundanalysispreprocessing(from);
      CoreMLModels::SoundAnalysisPreprocessing::MergeFrom(this_29,from_28);
      break;
    case 0x7d4:
      this_18 = mutable_gazetteer(this);
      from_17 = gazetteer(from);
      CoreMLModels::Gazetteer::MergeFrom(this_18,from_17);
      break;
    case 0x7d5:
      this_34 = mutable_wordembedding(this);
      from_33 = wordembedding(from);
      CoreMLModels::WordEmbedding::MergeFrom(this_34,from_33);
      break;
    default:
      switch(uVar1) {
      case 300:
        this_05 = mutable_glmregressor(this);
        from_04 = glmregressor(from);
        GLMRegressor::MergeFrom(this_05,from_04);
        break;
      case 0x12d:
        this_31 = mutable_supportvectorregressor(this);
        from_30 = supportvectorregressor(from);
        SupportVectorRegressor::MergeFrom(this_31,from_30);
        break;
      case 0x12e:
        this_25 = mutable_treeensembleregressor(this);
        from_24 = treeensembleregressor(from);
        TreeEnsembleRegressor::MergeFrom(this_25,from_24);
        break;
      case 0x12f:
        this_28 = mutable_neuralnetworkregressor(this);
        from_27 = neuralnetworkregressor(from);
        NeuralNetworkRegressor::MergeFrom(this_28,from_27);
        break;
      case 0x130:
        this_17 = mutable_bayesianprobitregressor(this);
        from_16 = bayesianprobitregressor(from);
        BayesianProbitRegressor::MergeFrom(this_17,from_16);
        break;
      default:
        switch(uVar1) {
        case 400:
          this_04 = mutable_glmclassifier(this);
          from_03 = glmclassifier(from);
          GLMClassifier::MergeFrom(this_04,from_03);
          break;
        case 0x191:
          this_27 = mutable_supportvectorclassifier(this);
          from_26 = supportvectorclassifier(from);
          SupportVectorClassifier::MergeFrom(this_27,from_26);
          break;
        case 0x192:
          this_19 = mutable_treeensembleclassifier(this);
          from_18 = treeensembleclassifier(from);
          TreeEnsembleClassifier::MergeFrom(this_19,from_18);
          break;
        case 0x193:
          this_23 = mutable_neuralnetworkclassifier(this);
          from_22 = neuralnetworkclassifier(from);
          NeuralNetworkClassifier::MergeFrom(this_23,from_22);
          break;
        case 0x194:
          this_15 = mutable_knearestneighborsclassifier(this);
          from_14 = knearestneighborsclassifier(from);
          KNearestNeighborsClassifier::MergeFrom(this_15,from_14);
          break;
        default:
          if (uVar1 == 3000) {
            this_20 = mutable_serializedmodel(this);
            from_19 = serializedmodel(from);
            SerializedModel::MergeFrom(this_20,from_19);
          }
          else if (uVar1 == 0xc9) {
            this_33 = mutable_pipelineregressor(this);
            from_32 = pipelineregressor(from);
            PipelineRegressor::MergeFrom(this_33,from_32);
          }
          else if (uVar1 == 0xca) {
            this_14 = mutable_pipeline(this);
            from_13 = pipeline(from);
            Pipeline::MergeFrom(this_14,from_13);
          }
          else if (uVar1 == 500) {
            this_16 = mutable_neuralnetwork(this);
            from_15 = neuralnetwork(from);
            NeuralNetwork::MergeFrom(this_16,from_15);
          }
          else if (uVar1 == 0x1f5) {
            this_21 = mutable_itemsimilarityrecommender(this);
            from_20 = itemsimilarityrecommender(from);
            ItemSimilarityRecommender::MergeFrom(this_21,from_20);
          }
          else if (uVar1 == 0x22b) {
            this_30 = mutable_custommodel(this);
            from_29 = custommodel(from);
            CustomModel::MergeFrom(this_30,from_29);
          }
          else if (uVar1 == 0x22c) {
            this_24 = mutable_linkedmodel(this);
            from_23 = linkedmodel(from);
            LinkedModel::MergeFrom(this_24,from_23);
          }
          else if (uVar1 == 900) {
            this_22 = mutable_identity(this);
            from_21 = identity(from);
            Identity::MergeFrom(this_22,from_21);
          }
          else if (uVar1 == 200) {
            this_01 = mutable_pipelineclassifier(this);
            from_00 = pipelineclassifier(from);
            PipelineClassifier::MergeFrom(this_01,from_00);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Model::MergeFrom(const Model& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.Model)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_description()) {
    mutable_description()->::CoreML::Specification::ModelDescription::MergeFrom(from.description());
  }
  if (from.specificationversion() != 0) {
    set_specificationversion(from.specificationversion());
  }
  if (from.isupdatable() != 0) {
    set_isupdatable(from.isupdatable());
  }
  switch (from.Type_case()) {
    case kPipelineClassifier: {
      mutable_pipelineclassifier()->::CoreML::Specification::PipelineClassifier::MergeFrom(from.pipelineclassifier());
      break;
    }
    case kPipelineRegressor: {
      mutable_pipelineregressor()->::CoreML::Specification::PipelineRegressor::MergeFrom(from.pipelineregressor());
      break;
    }
    case kPipeline: {
      mutable_pipeline()->::CoreML::Specification::Pipeline::MergeFrom(from.pipeline());
      break;
    }
    case kGlmRegressor: {
      mutable_glmregressor()->::CoreML::Specification::GLMRegressor::MergeFrom(from.glmregressor());
      break;
    }
    case kSupportVectorRegressor: {
      mutable_supportvectorregressor()->::CoreML::Specification::SupportVectorRegressor::MergeFrom(from.supportvectorregressor());
      break;
    }
    case kTreeEnsembleRegressor: {
      mutable_treeensembleregressor()->::CoreML::Specification::TreeEnsembleRegressor::MergeFrom(from.treeensembleregressor());
      break;
    }
    case kNeuralNetworkRegressor: {
      mutable_neuralnetworkregressor()->::CoreML::Specification::NeuralNetworkRegressor::MergeFrom(from.neuralnetworkregressor());
      break;
    }
    case kBayesianProbitRegressor: {
      mutable_bayesianprobitregressor()->::CoreML::Specification::BayesianProbitRegressor::MergeFrom(from.bayesianprobitregressor());
      break;
    }
    case kGlmClassifier: {
      mutable_glmclassifier()->::CoreML::Specification::GLMClassifier::MergeFrom(from.glmclassifier());
      break;
    }
    case kSupportVectorClassifier: {
      mutable_supportvectorclassifier()->::CoreML::Specification::SupportVectorClassifier::MergeFrom(from.supportvectorclassifier());
      break;
    }
    case kTreeEnsembleClassifier: {
      mutable_treeensembleclassifier()->::CoreML::Specification::TreeEnsembleClassifier::MergeFrom(from.treeensembleclassifier());
      break;
    }
    case kNeuralNetworkClassifier: {
      mutable_neuralnetworkclassifier()->::CoreML::Specification::NeuralNetworkClassifier::MergeFrom(from.neuralnetworkclassifier());
      break;
    }
    case kKNearestNeighborsClassifier: {
      mutable_knearestneighborsclassifier()->::CoreML::Specification::KNearestNeighborsClassifier::MergeFrom(from.knearestneighborsclassifier());
      break;
    }
    case kNeuralNetwork: {
      mutable_neuralnetwork()->::CoreML::Specification::NeuralNetwork::MergeFrom(from.neuralnetwork());
      break;
    }
    case kItemSimilarityRecommender: {
      mutable_itemsimilarityrecommender()->::CoreML::Specification::ItemSimilarityRecommender::MergeFrom(from.itemsimilarityrecommender());
      break;
    }
    case kCustomModel: {
      mutable_custommodel()->::CoreML::Specification::CustomModel::MergeFrom(from.custommodel());
      break;
    }
    case kLinkedModel: {
      mutable_linkedmodel()->::CoreML::Specification::LinkedModel::MergeFrom(from.linkedmodel());
      break;
    }
    case kOneHotEncoder: {
      mutable_onehotencoder()->::CoreML::Specification::OneHotEncoder::MergeFrom(from.onehotencoder());
      break;
    }
    case kImputer: {
      mutable_imputer()->::CoreML::Specification::Imputer::MergeFrom(from.imputer());
      break;
    }
    case kFeatureVectorizer: {
      mutable_featurevectorizer()->::CoreML::Specification::FeatureVectorizer::MergeFrom(from.featurevectorizer());
      break;
    }
    case kDictVectorizer: {
      mutable_dictvectorizer()->::CoreML::Specification::DictVectorizer::MergeFrom(from.dictvectorizer());
      break;
    }
    case kScaler: {
      mutable_scaler()->::CoreML::Specification::Scaler::MergeFrom(from.scaler());
      break;
    }
    case kCategoricalMapping: {
      mutable_categoricalmapping()->::CoreML::Specification::CategoricalMapping::MergeFrom(from.categoricalmapping());
      break;
    }
    case kNormalizer: {
      mutable_normalizer()->::CoreML::Specification::Normalizer::MergeFrom(from.normalizer());
      break;
    }
    case kArrayFeatureExtractor: {
      mutable_arrayfeatureextractor()->::CoreML::Specification::ArrayFeatureExtractor::MergeFrom(from.arrayfeatureextractor());
      break;
    }
    case kNonMaximumSuppression: {
      mutable_nonmaximumsuppression()->::CoreML::Specification::NonMaximumSuppression::MergeFrom(from.nonmaximumsuppression());
      break;
    }
    case kIdentity: {
      mutable_identity()->::CoreML::Specification::Identity::MergeFrom(from.identity());
      break;
    }
    case kTextClassifier: {
      mutable_textclassifier()->::CoreML::Specification::CoreMLModels::TextClassifier::MergeFrom(from.textclassifier());
      break;
    }
    case kWordTagger: {
      mutable_wordtagger()->::CoreML::Specification::CoreMLModels::WordTagger::MergeFrom(from.wordtagger());
      break;
    }
    case kVisionFeaturePrint: {
      mutable_visionfeatureprint()->::CoreML::Specification::CoreMLModels::VisionFeaturePrint::MergeFrom(from.visionfeatureprint());
      break;
    }
    case kSoundAnalysisPreprocessing: {
      mutable_soundanalysispreprocessing()->::CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing::MergeFrom(from.soundanalysispreprocessing());
      break;
    }
    case kGazetteer: {
      mutable_gazetteer()->::CoreML::Specification::CoreMLModels::Gazetteer::MergeFrom(from.gazetteer());
      break;
    }
    case kWordEmbedding: {
      mutable_wordembedding()->::CoreML::Specification::CoreMLModels::WordEmbedding::MergeFrom(from.wordembedding());
      break;
    }
    case kSerializedModel: {
      mutable_serializedmodel()->::CoreML::Specification::SerializedModel::MergeFrom(from.serializedmodel());
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
}